

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::~parallel_hash_set
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *this)

{
  Inner *pIVar1;
  slot_type **ppsVar2;
  size_t sVar3;
  slot_type *psVar4;
  int *piVar5;
  Inner *pIVar6;
  tuple<unsigned_long,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *alloc;
  size_t i;
  size_t sVar7;
  Layout LVar8;
  
  pIVar6 = (Inner *)(this + 1);
  do {
    pIVar1 = (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                *)((long)pIVar6 + -0x300))->sets_)._M_elems + 0xf;
    sVar3 = (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.capacity_;
    if (sVar3 != 0) {
      ppsVar2 = &(((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                    *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.slots_;
      sVar7 = 0;
      do {
        if (-1 < (pIVar1->set_).ctrl_[sVar7]) {
          psVar4 = *ppsVar2;
          piVar5 = psVar4[sVar7]._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar5 != (int *)0x0) {
            operator_delete(piVar5,4);
          }
          psVar4[sVar7]._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        }
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
      LVar8 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
              ::MakeLayout((((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                              *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.capacity_);
      alloc = &(((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                  *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.settings_;
      Deallocate<8ul,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                ((allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *)alloc,
                 (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                    *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.ctrl_,
                 (LVar8.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_>.size_[0]
                  + 7 & 0xfffffffffffffff8) +
                 LVar8.super_LayoutType<sizeof___(Ts),_signed_char,_std::unique_ptr<int>_>.size_[1]
                 * 8);
      (pIVar1->set_).ctrl_ =
           &EmptyGroup<std::is_same<std::allocator<std::unique_ptr<int,std::default_delete<int>>>,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>>()
            ::empty_group;
      (alloc->
      super__Tuple_impl<0UL,_unsigned_long,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
      (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.capacity_ = 0;
      *ppsVar2 = (slot_type *)0x0;
      (((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         *)((long)pIVar6 + -0x300))->sets_)._M_elems[0xf].set_.size_ = 0;
    }
    pIVar6 = pIVar1;
  } while ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            *)pIVar1 != this);
  return;
}

Assistant:

~parallel_hash_set() {}